

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifvin(bifcxdef *ctx,int argc)

{
  objnum verb_in;
  runsdef *prVar1;
  int iVar2;
  uchar *puVar3;
  runcxdef *prVar4;
  uint siz;
  objnum prep;
  uint16_t tmp;
  uchar tplbuf [16];
  int newstyle;
  runsdef val;
  uchar local_58 [2];
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  byte local_4e;
  int local_44;
  runsdef local_40;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  prVar4 = ctx->bifcxrun;
  if (prVar1[-1].runstyp == '\x02') {
    prVar1 = prVar4->runcxsp;
    verb_in = (prVar1->runsv).runsvobj;
    prep = 0xffff;
    if (argc != 1) {
      prVar4->runcxsp = prVar1 + -1;
      prVar4 = ctx->bifcxrun;
      if (prVar1[-1].runstyp != '\x02') goto LAB_00124a44;
      prep = (prVar4->runcxsp->runsv).runsvobj;
    }
    iVar2 = voctplfnd(prVar4->runcxvoc,verb_in,prep,local_58,&local_44);
    if (iVar2 == 0) {
      runpnil(ctx->bifcxrun);
    }
    else {
      siz = (uint)(prep != 0xffff) * 4 + 8;
      prVar4 = ctx->bifcxrun;
      puVar3 = prVar4->runcxhp;
      if ((uint)(*(int *)&prVar4->runcxhtop - (int)puVar3) <= siz) {
        runhcmp(prVar4,siz,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
        puVar3 = ctx->bifcxrun->runcxhp;
      }
      *(short *)puVar3 = (short)siz;
      puVar3[2] = '\r';
      *(undefined2 *)(puVar3 + 3) = local_52;
      if (prep != 0xffff) {
        puVar3[8] = '\r';
        *(undefined2 *)(puVar3 + 9) = local_54;
        puVar3[0xb] = ((local_4e & 1) != 0) * '\x03' + '\x05';
        local_50 = local_56;
      }
      puVar3[5] = '\r';
      *(undefined2 *)(puVar3 + 6) = local_50;
      local_40.runstyp = '\a';
      local_40.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
      ctx->bifcxrun->runcxhp = local_40.runsv.runsvstr + siz;
      runrepush(ctx->bifcxrun,&local_40);
    }
    return;
  }
LAB_00124a44:
  prVar4->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3f2);
}

Assistant:

void bifvin(bifcxdef *ctx, int argc)
{
    objnum  verb;
    objnum  prep;
    uchar   tplbuf[VOCTPL2SIZ];
    int     newstyle;

    /* get the verb */
    verb = runpopobj(ctx->bifcxrun);
    
    /* check for the presence of a preposition */
    if (argc == 1)
    {
        /* no preposition */
        prep = MCMONINV;
    }
    else
    {
        /* the second argument is the preposition */
        bifcntargs(ctx, 2, argc);
        prep = runpopobj(ctx->bifcxrun);
    }

    /* look up the template */
    if (voctplfnd(ctx->bifcxrun->runcxvoc, verb, prep, tplbuf, &newstyle))
    {
        prpnum   prp_do, prp_verdo, prp_io, prp_verio;
        int      flg_dis_do;
        ushort   siz;
        uchar   *p;
        runsdef  val;

        /* get the information from the template */
        prp_do     = voctpldo(tplbuf);
        prp_verdo  = voctplvd(tplbuf);
        prp_io     = voctplio(tplbuf);
        prp_verio  = voctplvi(tplbuf);
        flg_dis_do = (voctplflg(tplbuf) & VOCTPLFLG_DOBJ_FIRST) != 0;

        /*
         *   figure space for the return value: if there's a prep, three
         *   property pointers plus a boolean, otherwise just two property
         *   pointers 
         */
        siz = 2 + 2*(2+1);
        if (prep != MCMONINV)
            siz += (2+1) + 1;

        /* reserve the space */
        runhres(ctx->bifcxrun, siz, 0);

        /* build the output list */
        p = ctx->bifcxrun->runcxhp;
        oswp2(p, siz);
        p += 2;

        p = bifvin_putprpn(p, prp_verdo);
        if (prep == MCMONINV)
        {
            p = bifvin_putprpn(p, prp_do);
        }
        else
        {
            p = bifvin_putprpn(p, prp_verio);
            p = bifvin_putprpn(p, prp_io);
            *p++ = runclog(flg_dis_do);
        }

        /* build the return value */
        val.runstyp = DAT_LIST;
        val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

        /* consume the space */
        ctx->bifcxrun->runcxhp += siz;

        /* return the list */
        runrepush(ctx->bifcxrun, &val);
    }
    else
    {
        /* no template for this verb - return nil */
        runpnil(ctx->bifcxrun);
    }
}